

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::AddEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  int number;
  uint32_t uVar1;
  Type TVar2;
  int local_24;
  
  if (((byte)field[1] & 8) == 0) {
    AddField<int>(this,message,field,&local_24);
    return;
  }
  uVar1 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
  number = *(int *)(field + 4);
  TVar2 = FieldDescriptor::type(field);
  internal::ExtensionSet::AddEnum
            ((ExtensionSet *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),
             number,(FieldType)TVar2,*(bool *)(*(long *)(field + 0x38) + 0x4c),value,field);
  return;
}

Assistant:

void Reflection::AddEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(), value,
                                          field);
  } else {
    AddField<int>(message, field, value);
  }
}